

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastSmS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ParseContext *pPVar1;
  MessageLite *pMVar2;
  uint64_t uVar3;
  TcParseTableBase *this;
  uchar uVar4;
  byte bVar5;
  bool bVar6;
  uint16_t uVar7;
  unsigned_short uVar8;
  uint32_t decoded_tag;
  uint uVar9;
  char *pcVar10;
  uint *puVar11;
  ulong uVar12;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  string_view str;
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_1d0;
  Arena *local_1c8;
  Arena *arena;
  MicroString *field;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_1b0;
  uchar saved_tag;
  uint64_t local_1a8;
  TcParseTableBase *local_1a0;
  ParseContext *local_198;
  char *local_190;
  MessageLite *local_188;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_180;
  TcFieldData local_178;
  TcFieldData local_170;
  undefined1 local_161;
  ulong uStack_160;
  bool always_return;
  TcParseTableBase *local_158;
  ParseContext *local_150;
  char *local_148;
  MessageLite *local_140;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_138;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_130;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_128;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  uint32_t has_bits_offset;
  
  local_1a8 = hasbits;
  local_1a0 = table;
  local_198 = ctx;
  local_190 = ptr;
  local_188 = msg;
  local_180 = data.field_0;
  uVar4 = TcFieldData::coded_tag<unsigned_char>((TcFieldData *)&local_180);
  pMVar2 = local_188;
  pcVar10 = local_190;
  pPVar1 = local_198;
  if (uVar4 != '\0') {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffe50);
    pcVar10 = MiniParse(pMVar2,pcVar10,pPVar1,(TcFieldData)aStack_1b0,local_1a0,local_1a8);
    return pcVar10;
  }
  field._7_1_ = UnalignedLoad<unsigned_char>(local_190);
  local_190 = local_190 + 1;
  bVar5 = TcFieldData::hasbit_idx((TcFieldData *)&local_180);
  pMVar2 = local_188;
  local_1a8 = 1L << (bVar5 & 0x3f) | local_1a8;
  uVar7 = TcFieldData::offset((TcFieldData *)&local_180);
  arena = (Arena *)RefAt<google::protobuf::internal::MicroString>(pMVar2,(ulong)uVar7);
  local_1c8 = MessageLite::GetArena(local_188);
  pcVar10 = local_190;
  pPVar1 = local_198;
  if (local_1c8 == (Arena *)0x0) {
    TcFieldData::aux_idx((TcFieldData *)&local_180);
    local_190 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(MicroString *)arena,
                           (Arena *)0x0);
  }
  else {
    TcFieldData::aux_idx((TcFieldData *)&local_180);
    local_190 = EpsCopyInputStream::ReadMicroString
                          (&pPVar1->super_EpsCopyInputStream,pcVar10,(MicroString *)arena,local_1c8)
    ;
  }
  if (local_190 != (char *)0x0) {
    str = MicroString::Get((MicroString *)arena);
    bVar6 = utf8_range::IsStructurallyValid(str);
    if (!bVar6) {
      decoded_tag = FastDecodeTag(field._7_1_);
      ReportFastUtf8Error(decoded_tag,local_1a0);
    }
    pMVar2 = local_188;
    pcVar10 = local_190;
    pPVar1 = local_198;
    TcFieldData::TcFieldData(&data_local);
    local_138 = data_local.field_0;
    local_140 = pMVar2;
    local_148 = pcVar10;
    local_150 = pPVar1;
    local_158 = local_1a0;
    uStack_160 = local_1a8;
    local_161 = 0;
    bVar6 = EpsCopyInputStream::DataAvailable(&pPVar1->super_EpsCopyInputStream,pcVar10);
    pMVar2 = local_140;
    pcVar10 = local_148;
    pPVar1 = local_150;
    if (bVar6) {
      TcFieldData::TcFieldData(&local_178);
      this = local_158;
      uVar3 = uStack_160;
      uVar8 = UnalignedLoad<unsigned_short>(pcVar10);
      uVar12 = (ulong)(int)((uint)uVar8 & (uint)this->fast_idx_mask);
      if ((uVar12 & 7) == 0) {
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(this,uVar12 >> 3);
        local_128.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data ^
             (ulong)uVar8;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_130.data = local_128.data;
        pcVar10 = (*UNRECOVERED_JUMPTABLE)(pMVar2,pcVar10,pPVar1,(TcFieldData)local_128,this,uVar3);
        return pcVar10;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    TcFieldData::TcFieldData(&local_170);
    if (local_158->has_bits_offset != 0) {
      uVar9 = (uint)uStack_160;
      puVar11 = RefAt<unsigned_int>(pMVar2,(ulong)(uint)local_158->has_bits_offset);
      *puVar11 = uVar9 | *puVar11;
    }
    return pcVar10;
  }
  anon_unknown_104::EnsureArenaStringIsNotDefault(local_188,arena);
  pMVar2 = local_188;
  pcVar10 = local_190;
  pPVar1 = local_198;
  TcFieldData::TcFieldData((TcFieldData *)&local_1d0);
  pcVar10 = Error(pMVar2,pcVar10,pPVar1,(TcFieldData)local_1d0,local_1a0,local_1a8);
  return pcVar10;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastSmS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularString<uint8_t, MicroString,
                                          kUtf8ValidateOnly>(
      PROTOBUF_TC_PARAM_PASS);
}